

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QFixed flowPosition(iterator *it)

{
  bool bVar1;
  int iVar2;
  QTextFrame *pQVar3;
  QTextFrameData *pQVar4;
  QTextLayout *pQVar5;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QTextLayout *layout;
  QTextBlock block;
  qreal in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  iterator *in_stack_ffffffffffffff98;
  int i;
  QPointF local_40;
  QPointF local_30;
  QFixed local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QTextFrame::iterator::atEnd(in_RDI);
  if (bVar1) {
    QFixed::QFixed(&local_1c,0);
  }
  else {
    pQVar3 = QTextFrame::iterator::currentFrame(in_RDI);
    if (pQVar3 == (QTextFrame *)0x0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::iterator::currentBlock(in_stack_ffffffffffffff98);
      pQVar5 = QTextBlock::layout((QTextBlock *)in_stack_ffffffffffffff98);
      i = (int)((ulong)pQVar5 >> 0x20);
      iVar2 = QTextLayout::lineCount((QTextLayout *)0x809c96);
      if (iVar2 == 0) {
        local_30 = QTextLayout::position((QTextLayout *)in_stack_ffffffffffffff98);
        QPointF::y(&local_30);
        local_1c = QFixed::fromReal(in_stack_ffffffffffffff88);
      }
      else {
        local_40 = QTextLayout::position((QTextLayout *)in_stack_ffffffffffffff98);
        QPointF::y(&local_40);
        QTextLayout::lineAt((QTextLayout *)in_RDI,i);
        QTextLine::y((QTextLine *)0x809d0b);
        local_1c = QFixed::fromReal(in_stack_ffffffffffffff88);
      }
    }
    else {
      QTextFrame::iterator::currentFrame(in_RDI);
      pQVar4 = data((QTextFrame *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_1c.val = (pQVar4->position).y.val;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFixed)local_1c.val;
  }
  __stack_chk_fail();
}

Assistant:

static QFixed flowPosition(const QTextFrame::iterator &it)
{
    if (it.atEnd())
        return 0;

    if (it.currentFrame()) {
        return data(it.currentFrame())->position.y;
    } else {
        QTextBlock block = it.currentBlock();
        QTextLayout *layout = block.layout();
        if (layout->lineCount() == 0)
            return QFixed::fromReal(layout->position().y());
        else
            return QFixed::fromReal(layout->position().y() + layout->lineAt(0).y());
    }
}